

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
AdapterPromiseNode<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>,_kj::_::PromiseAndFulfillerAdapter<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_>_>
::reject(AdapterPromiseNode<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>,_kj::_::PromiseAndFulfillerAdapter<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_>_>
         *this,Exception *exception)

{
  ExceptionOr<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> local_190;
  
  if (this->waiting == true) {
    this->waiting = false;
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&local_190,exception);
    local_190.value.ptr.isSet = false;
    ExceptionOr<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_>::operator=
              (&this->result,&local_190);
    ExceptionOr<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_>::~ExceptionOr(&local_190);
    PromiseNode::OnReadyEvent::arm(&(this->super_AdapterPromiseNodeBase).onReadyEvent);
  }
  return;
}

Assistant:

void reject(Exception&& exception) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(false, kj::mv(exception));
      setReady();
    }
  }